

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameTokenFind(Parse *pParse,RenameCtx *pCtx,void *pPtr)

{
  RenameToken *pRVar1;
  RenameToken *pToken;
  RenameToken **pp;
  void *pPtr_local;
  RenameCtx *pCtx_local;
  Parse *pParse_local;
  
  pp = &pParse->pRename;
  while( true ) {
    if (*pp == (RenameToken *)0x0) {
      return;
    }
    if ((*pp)->p == pPtr) break;
    pp = &(*pp)->pNext;
  }
  pRVar1 = *pp;
  *pp = pRVar1->pNext;
  pRVar1->pNext = pCtx->pList;
  pCtx->pList = pRVar1;
  pCtx->nList = pCtx->nList + 1;
  return;
}

Assistant:

static void renameTokenFind(Parse *pParse, struct RenameCtx *pCtx, void *pPtr){
  RenameToken **pp;
  assert( pPtr!=0 );
  for(pp=&pParse->pRename; (*pp); pp=&(*pp)->pNext){
    if( (*pp)->p==pPtr ){
      RenameToken *pToken = *pp;
      *pp = pToken->pNext;
      pToken->pNext = pCtx->pList;
      pCtx->pList = pToken;
      pCtx->nList++;
      break;
    }
  }
}